

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_utils.h
# Opt level: O0

unsigned_long
phmap::HashStateBase<unsigned_long>::combine<std::__cxx11::string,int>
          (unsigned_long seed,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v,
          int *vs)

{
  size_t k;
  unsigned_long uVar1;
  Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_22;
  Combiner<unsigned_long,_8> local_21;
  int *local_20;
  int *vs_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v_local;
  unsigned_long seed_local;
  
  local_20 = vs;
  vs_local = (int *)v;
  v_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)seed;
  k = Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator()(&local_22,v);
  uVar1 = Combiner<unsigned_long,_8>::operator()(&local_21,seed,k);
  uVar1 = combine<int>(uVar1,local_20);
  return uVar1;
}

Assistant:

H HashStateBase<H>::combine(H seed, const T& v, const Ts&... vs)
{
    return HashStateBase<H>::combine(Combiner<H, sizeof(H)>()(
                                         seed, phmap::Hash<T>()(v)), 
                                     vs...);
}